

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Pipeline * __thiscall
CoreML::Specification::PipelineClassifier::mutable_pipeline(PipelineClassifier *this)

{
  Pipeline *this_00;
  PipelineClassifier *this_local;
  
  if (this->pipeline_ == (Pipeline *)0x0) {
    this_00 = (Pipeline *)operator_new(0x48);
    Pipeline::Pipeline(this_00);
    this->pipeline_ = this_00;
  }
  return this->pipeline_;
}

Assistant:

inline ::CoreML::Specification::Pipeline* PipelineClassifier::mutable_pipeline() {
  
  if (pipeline_ == NULL) {
    pipeline_ = new ::CoreML::Specification::Pipeline;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PipelineClassifier.pipeline)
  return pipeline_;
}